

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O0

void __thiscall Indexing::Index::attachContainer(Index *this,ClauseContainer *cc)

{
  SmartPtr<Lib::SubscriptionObject> *in_RDI;
  SmartPtr<Lib::SubscriptionObject> *in_stack_ffffffffffffffa8;
  SmartPtr<Lib::SubscriptionObject> *ptr;
  SmartPtr<Lib::SubscriptionObject> *in_stack_ffffffffffffffb0;
  Index *in_stack_ffffffffffffffc0;
  SingleParamEvent<Kernel::Clause_*> *in_stack_ffffffffffffffc8;
  
  Lib::SingleParamEvent<Kernel::Clause_*>::subscribe<Indexing::Index>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (offset_in_Index_to_subr)in_stack_ffffffffffffffb0);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(in_RDI);
  ptr = (SmartPtr<Lib::SubscriptionObject> *)0x0;
  Lib::SingleParamEvent<Kernel::Clause_*>::subscribe<Indexing::Index>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (offset_in_Index_to_subr)in_stack_ffffffffffffffb0);
  Lib::SmartPtr<Lib::SubscriptionObject>::operator=(in_stack_ffffffffffffffb0,ptr);
  Lib::SmartPtr<Lib::SubscriptionObject>::~SmartPtr(in_RDI);
  return;
}

Assistant:

void Index::attachContainer(ClauseContainer* cc)
{
  ASS(_addedSD.isEmpty()); //only one container can be attached

  _addedSD = cc->addedEvent.subscribe(this,&Index::onAddedToContainer);
  _removedSD = cc->removedEvent.subscribe(this,&Index::onRemovedFromContainer);
}